

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall CCharacter::FireWeapon(CCharacter *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  CGameWorld *pCVar5;
  IServer *pIVar6;
  IConsole *pIVar7;
  CCharacter *this_00;
  CGameWorld *pCVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  CLaser *this_01;
  CProjectile *pCVar14;
  uint uVar15;
  uint uVar16;
  CGameContext *this_02;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long in_FS_OFFSET;
  vec2 Force;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar27;
  vec2 vVar29;
  float fVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vec2 Pos;
  vec2 vVar32;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float local_268;
  char aBuf [256];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_ReloadTimer != 0) goto LAB_00115f91;
  if ((this->m_QueuedWeapon != -1) && (this->m_aWeapons[5].m_Got == false)) {
    SetWeapon(this,this->m_QueuedWeapon);
  }
  uVar12 = this->m_ActiveWeapon;
  uVar20 = (ulong)uVar12;
  uVar17 = (this->m_LatestPrevInput).m_Fire;
  uVar3 = (this->m_LatestInput).m_Fire;
  uVar16 = uVar3 & 0x3f;
  uVar18 = uVar17 & 0x3f;
  uVar15 = 0;
  if (uVar18 != uVar16) {
    do {
      uVar19 = uVar18 + 1;
      uVar15 = uVar15 + (~uVar17 & 1);
      uVar18 = uVar19 & 0x3f;
      uVar17 = uVar19;
    } while (uVar18 != uVar16);
    uVar15 = (uint)(uVar15 != 0);
  }
  uVar1 = (this->m_LatestInput).m_TargetX;
  uVar2 = (this->m_LatestInput).m_TargetY;
  if ((uVar3 & 1) == 0 || uVar12 - 5 < 0xfffffffd) {
    if ((char)uVar15 == '\0') goto LAB_00115f91;
  }
  else if (this->m_aWeapons[uVar20].m_Ammo == 0 && uVar15 == 0) goto LAB_00115f91;
  if (this->m_aWeapons[(int)uVar12].m_Ammo == 0) {
    pCVar5 = (this->super_CEntity).m_pGameWorld;
    pIVar6 = pCVar5->m_pServer;
    iVar11 = pIVar6->m_TickSpeed;
    iVar13 = iVar11 + 7;
    if (-1 < iVar11) {
      iVar13 = iVar11;
    }
    this->m_ReloadTimer = iVar13 >> 3;
    if (iVar11 + this->m_LastNoAmmoSound <= pIVar6->m_CurrentGameTick) {
      CGameContext::CreateSound(pCVar5->m_pGameServer,(this->super_CEntity).m_Pos,0x1e,-1);
      this->m_LastNoAmmoSound = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_CurrentGameTick;
    }
    goto LAB_00115f91;
  }
  uVar10 = (this->super_CEntity).m_ProximityRadius;
  vVar32 = (this->super_CEntity).m_Pos;
  pCVar5 = (this->super_CEntity).m_pGameWorld;
  fVar22 = (this->super_CEntity).m_ProximityRadius;
  if (pCVar5->m_pConfig->m_Debug != 0) {
    uVar12 = this->m_pPlayer->m_ClientID;
    pIVar6 = pCVar5->m_pServer;
    iVar11 = (*(pIVar6->super_IInterface)._vptr_IInterface[2])(pIVar6,(ulong)uVar12);
    str_format(aBuf,0x100,"shot player=\'%d:%s\' team=%d weapon=%d",(ulong)uVar12,
               CONCAT44(extraout_var,iVar11),(ulong)(uint)this->m_pPlayer->m_Team,
               (ulong)(uint)this->m_ActiveWeapon);
    pIVar7 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_pConsole;
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x19])(pIVar7,2,"game",aBuf,0);
    uVar20 = (ulong)(uint)this->m_ActiveWeapon;
    fVar22 = (float)uVar10;
  }
  if ((uint)uVar20 < 6) {
    auVar33._0_4_ = (float)(int)uVar1;
    auVar33._4_4_ = (float)(int)uVar2;
    auVar33._8_8_ = 0;
    auVar30._0_4_ = SQRT(auVar33._0_4_ * auVar33._0_4_ + auVar33._4_4_ * auVar33._4_4_);
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    auVar30 = divps(auVar33,auVar30);
    Pos.field_0.x = vVar32.field_0.x + fVar22 * auVar30._0_4_ * 0.75;
    Pos.field_1.y = vVar32.field_1.y + fVar22 * auVar30._4_4_ * 0.75;
    vVar32 = auVar30._0_8_;
    switch(uVar20) {
    case 0:
      CGameContext::CreateSound
                (((this->super_CEntity).m_pGameWorld)->m_pGameServer,(this->super_CEntity).m_Pos,3,
                 -1);
      uVar12 = CGameWorld::FindEntities
                         ((this->super_CEntity).m_pGameWorld,Pos,
                          (this->super_CEntity).m_ProximityRadius * 0.5,(CEntity **)aBuf,0x40,3);
      if (0 < (int)uVar12) {
        uVar20 = 0;
        iVar11 = 0;
        do {
          this_00 = *(CCharacter **)(aBuf + uVar20 * 8);
          if ((this_00 != this) &&
             (iVar13 = CCollision::IntersectLine
                                 (&((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Collision,
                                  Pos,(this_00->super_CEntity).m_Pos,(vec2 *)0x0,(vec2 *)0x0),
             iVar13 == 0)) {
            vVar32 = (this_00->super_CEntity).m_Pos;
            aVar27 = vVar32.field_0;
            auVar26._0_4_ = aVar27.x - Pos.field_0.x;
            aVar35 = vVar32.field_1;
            auVar26._4_4_ = aVar35.y - Pos.field_1.y;
            auVar26._8_4_ = 0.0 - (fVar22 * auVar30._8_4_ * 0.0 + 0.0);
            auVar26._12_4_ = 0.0 - (fVar22 * auVar30._12_4_ * 0.0 + 0.0);
            fVar23 = SQRT(auVar26._0_4_ * auVar26._0_4_ + auVar26._4_4_ * auVar26._4_4_);
            vVar29 = Pos;
            if (0.0 < fVar23) {
              auVar9._4_4_ = fVar23;
              auVar9._0_4_ = fVar23;
              auVar9._8_4_ = fVar23;
              auVar9._12_4_ = fVar23;
              auVar33 = divps(auVar26,auVar9);
              fVar23 = (this->super_CEntity).m_ProximityRadius;
              vVar29.field_0.x = aVar27.x + fVar23 * auVar33._0_4_ * -0.5;
              vVar29.field_1.y = aVar35.y + fVar23 * auVar33._4_4_ * -0.5;
            }
            CGameContext::CreateHammerHit
                      (((this->super_CEntity).m_pGameWorld)->m_pGameServer,vVar29);
            vVar32 = (this_00->super_CEntity).m_Pos;
            vVar29 = (this->super_CEntity).m_Pos;
            auVar31._0_4_ = vVar32.field_0.x - vVar29.field_0.x;
            auVar31._4_4_ = vVar32.field_1.y - vVar29.field_1.y;
            auVar31._8_8_ = 0;
            auVar24._0_4_ = SQRT(auVar31._0_4_ * auVar31._0_4_ + auVar31._4_4_ * auVar31._4_4_);
            if (0.0 < auVar24._0_4_) {
              auVar24._4_4_ = auVar24._0_4_;
              auVar24._8_4_ = auVar24._0_4_;
              auVar24._12_4_ = auVar24._0_4_;
              auVar33 = divps(auVar31,auVar24);
            }
            else {
              auVar33 = ZEXT816(0xbf80000000000000);
            }
            auVar25._0_4_ = auVar33._0_4_ + 0.0;
            auVar25._4_4_ = auVar33._4_4_ + -1.1;
            auVar25._8_4_ = auVar33._8_4_ + 0.0;
            auVar25._12_4_ = auVar33._12_4_ + 0.0;
            auVar34._0_4_ = SQRT(auVar25._0_4_ * auVar25._0_4_ + auVar25._4_4_ * auVar25._4_4_);
            auVar34._4_4_ = auVar34._0_4_;
            auVar34._8_4_ = auVar34._0_4_;
            auVar34._12_4_ = auVar34._0_4_;
            auVar26 = divps(auVar25,auVar34);
            Force.field_0.x = auVar26._0_4_ * 10.0 + 0.0;
            Force.field_1.y = auVar26._4_4_ * 10.0 + -1.0;
            TakeDamage(this_00,Force,(vec2)(auVar33._0_8_ ^ 0x8000000080000000),
                       ((g_pData->m_Weapons).m_Hammer.m_pBase)->m_Damage,this->m_pPlayer->m_ClientID
                       ,this->m_ActiveWeapon);
            iVar11 = iVar11 + 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar12 != uVar20);
        if (iVar11 != 0) {
          this->m_ReloadTimer = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_TickSpeed / 3;
        }
      }
      goto LAB_001167a2;
    case 1:
      pCVar14 = (CProjectile *)mem_alloc(0x68);
      mem_zero(pCVar14,0x68);
      pCVar5 = (this->super_CEntity).m_pGameWorld;
      CProjectile::CProjectile
                (pCVar14,pCVar5,1,this->m_pPlayer->m_ClientID,Pos,vVar32,
                 (int)(((float)(pCVar5->m_pGameServer->m_Tuning).m_GunLifetime.m_Value / 100.0) *
                      (float)pCVar5->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Gun.m_pBase)->m_Damage,false,0.0,-1,1);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      iVar11 = 0;
      break;
    case 2:
      iVar11 = -2;
      lVar21 = 0;
      do {
        fVar22 = atan2f(auVar30._4_4_,auVar30._0_4_);
        fVar22 = fVar22 + *(float *)((long)&DAT_00146d60 + lVar21);
        iVar13 = -iVar11;
        if (0 < iVar11) {
          iVar13 = iVar11;
        }
        fVar28 = (float)(((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Tuning).
                        m_ShotgunSpeeddiff.m_Value / 100.0;
        fVar28 = (1.0 - fVar28) * ((float)iVar13 * -0.5 + 1.0) + fVar28;
        pCVar14 = (CProjectile *)mem_alloc(0x68);
        mem_zero(pCVar14,0x68);
        pCVar5 = (this->super_CEntity).m_pGameWorld;
        iVar13 = this->m_pPlayer->m_ClientID;
        fVar23 = cosf(fVar22);
        fVar22 = sinf(fVar22);
        pCVar8 = (this->super_CEntity).m_pGameWorld;
        vVar32.field_0.x = fVar23 * fVar28;
        vVar32.field_1.y = fVar22 * fVar28;
        CProjectile::CProjectile
                  (pCVar14,pCVar5,2,iVar13,Pos,vVar32,
                   (int)(((float)(pCVar8->m_pGameServer->m_Tuning).m_ShotgunLifetime.m_Value / 100.0
                         ) * (float)pCVar8->m_pServer->m_TickSpeed),
                   ((g_pData->m_Weapons).m_Shotgun.m_pBase)->m_Damage,false,0.0,-1,2);
        lVar21 = lVar21 + 4;
        iVar11 = iVar11 + 1;
      } while (lVar21 != 0x14);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      iVar11 = 1;
      break;
    case 3:
      pCVar14 = (CProjectile *)mem_alloc(0x68);
      mem_zero(pCVar14,0x68);
      pCVar5 = (this->super_CEntity).m_pGameWorld;
      CProjectile::CProjectile
                (pCVar14,pCVar5,3,this->m_pPlayer->m_ClientID,Pos,vVar32,
                 (int)(((float)(pCVar5->m_pGameServer->m_Tuning).m_GrenadeLifetime.m_Value / 100.0)
                      * (float)pCVar5->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Grenade.m_pBase)->m_Damage,true,0.0,6,3);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      iVar11 = 2;
      break;
    case 4:
      this_01 = (CLaser *)mem_alloc(0x58);
      mem_zero(this_01,0x58);
      pCVar5 = (this->super_CEntity).m_pGameWorld;
      CLaser::CLaser(this_01,pCVar5,(this->super_CEntity).m_Pos,vVar32,
                     (float)(pCVar5->m_pGameServer->m_Tuning).m_LaserReach.m_Value / 100.0,
                     this->m_pPlayer->m_ClientID);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      iVar11 = 8;
      break;
    case 5:
      this->m_NumObjectsHit = 0;
      (this->m_Ninja).m_ActivationDir = vVar32;
      pCVar5 = (this->super_CEntity).m_pGameWorld;
      (this->m_Ninja).m_CurrentMoveTime =
           (pCVar5->m_pServer->m_TickSpeed * (g_pData->m_Weapons).m_Ninja.m_Movetime) / 1000;
      fVar22 = (this->m_Core).m_Vel.field_0.x;
      fVar23 = (this->m_Core).m_Vel.field_1.y;
      (this->m_Ninja).m_OldVelAmount = (int)SQRT(fVar22 * fVar22 + fVar23 * fVar23);
      this_02 = pCVar5->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      iVar11 = 5;
    }
    CGameContext::CreateSound(this_02,vVar32,iVar11,-1);
  }
LAB_001167a2:
  pIVar6 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
  this->m_AttackTick = pIVar6->m_CurrentGameTick;
  iVar11 = this->m_ActiveWeapon;
  iVar13 = this->m_aWeapons[iVar11].m_Ammo;
  if (0 < iVar13) {
    this->m_aWeapons[iVar11].m_Ammo = iVar13 + -1;
  }
  if (this->m_ReloadTimer == 0) {
    this->m_ReloadTimer =
         (pIVar6->m_TickSpeed * (g_pData->m_Weapons).m_aId[iVar11].m_Firedelay) / 1000;
  }
LAB_00115f91:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacter::FireWeapon()
{
	if(m_ReloadTimer != 0)
		return;

	DoWeaponSwitch();
	vec2 Direction = normalize(vec2(m_LatestInput.m_TargetX, m_LatestInput.m_TargetY));

	bool FullAuto = false;
	if(m_ActiveWeapon == WEAPON_GRENADE || m_ActiveWeapon == WEAPON_SHOTGUN || m_ActiveWeapon == WEAPON_LASER)
		FullAuto = true;


	// check if we gonna fire
	bool WillFire = false;
	if(CountInput(m_LatestPrevInput.m_Fire, m_LatestInput.m_Fire).m_Presses)
		WillFire = true;

	if(FullAuto && (m_LatestInput.m_Fire&1) && m_aWeapons[m_ActiveWeapon].m_Ammo)
		WillFire = true;

	if(!WillFire)
		return;

	// check for ammo
	if(!m_aWeapons[m_ActiveWeapon].m_Ammo)
	{
		// 125ms is a magical limit of how fast a human can click
		m_ReloadTimer = 125 * Server()->TickSpeed() / 1000;
		if(m_LastNoAmmoSound+Server()->TickSpeed() <= Server()->Tick())
		{
			GameServer()->CreateSound(m_Pos, SOUND_WEAPON_NOAMMO);
			m_LastNoAmmoSound = Server()->Tick();
		}
		return;
	}

	vec2 ProjStartPos = m_Pos+Direction*GetProximityRadius()*0.75f;

	if(Config()->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "shot player='%d:%s' team=%d weapon=%d", m_pPlayer->GetCID(), Server()->ClientName(m_pPlayer->GetCID()), m_pPlayer->GetTeam(), m_ActiveWeapon);
		GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
	}

	switch(m_ActiveWeapon)
	{
		case WEAPON_HAMMER:
		{
			GameServer()->CreateSound(m_Pos, SOUND_HAMMER_FIRE);

			CCharacter *apEnts[MAX_CLIENTS];
			int Hits = 0;
			int Num = GameWorld()->FindEntities(ProjStartPos, GetProximityRadius()*0.5f, (CEntity**)apEnts,
														MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);

			for(int i = 0; i < Num; ++i)
			{
				CCharacter *pTarget = apEnts[i];

				if((pTarget == this) || GameServer()->Collision()->IntersectLine(ProjStartPos, pTarget->m_Pos, NULL, NULL))
					continue;

				// set his velocity to fast upward (for now)
				if(length(pTarget->m_Pos-ProjStartPos) > 0.0f)
					GameServer()->CreateHammerHit(pTarget->m_Pos-normalize(pTarget->m_Pos-ProjStartPos)*GetProximityRadius()*0.5f);
				else
					GameServer()->CreateHammerHit(ProjStartPos);

				vec2 Dir;
				if(length(pTarget->m_Pos - m_Pos) > 0.0f)
					Dir = normalize(pTarget->m_Pos - m_Pos);
				else
					Dir = vec2(0.f, -1.f);

				pTarget->TakeDamage(vec2(0.f, -1.f) + normalize(Dir + vec2(0.f, -1.1f)) * 10.0f, Dir*-1, g_pData->m_Weapons.m_Hammer.m_pBase->m_Damage,
					m_pPlayer->GetCID(), m_ActiveWeapon);
				Hits++;
			}

			// if we Hit anything, we have to wait for the reload
			if(Hits)
				m_ReloadTimer = Server()->TickSpeed()/3;

		} break;

		case WEAPON_GUN:
		{
			new CProjectile(GameWorld(), WEAPON_GUN,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GunLifetime),
				g_pData->m_Weapons.m_Gun.m_pBase->m_Damage, false, 0, -1, WEAPON_GUN);

			GameServer()->CreateSound(m_Pos, SOUND_GUN_FIRE);
		} break;

		case WEAPON_SHOTGUN:
		{
			int ShotSpread = 2;

			for(int i = -ShotSpread; i <= ShotSpread; ++i)
			{
				float Spreading[] = {-0.185f, -0.070f, 0, 0.070f, 0.185f};
				float a = angle(Direction);
				a += Spreading[i+2];
				float v = 1-(absolute(i)/(float)ShotSpread);
				float Speed = mix((float)GameServer()->Tuning()->m_ShotgunSpeeddiff, 1.0f, v);
				new CProjectile(GameWorld(), WEAPON_SHOTGUN,
					m_pPlayer->GetCID(),
					ProjStartPos,
					vec2(cosf(a), sinf(a))*Speed,
					(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_ShotgunLifetime),
					g_pData->m_Weapons.m_Shotgun.m_pBase->m_Damage, false, 0, -1, WEAPON_SHOTGUN);
			}

			GameServer()->CreateSound(m_Pos, SOUND_SHOTGUN_FIRE);
		} break;

		case WEAPON_GRENADE:
		{
			new CProjectile(GameWorld(), WEAPON_GRENADE,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GrenadeLifetime),
				g_pData->m_Weapons.m_Grenade.m_pBase->m_Damage, true, 0, SOUND_GRENADE_EXPLODE, WEAPON_GRENADE);

			GameServer()->CreateSound(m_Pos, SOUND_GRENADE_FIRE);
		} break;

		case WEAPON_LASER:
		{
			new CLaser(GameWorld(), m_Pos, Direction, GameServer()->Tuning()->m_LaserReach, m_pPlayer->GetCID());
			GameServer()->CreateSound(m_Pos, SOUND_LASER_FIRE);
		} break;

		case WEAPON_NINJA:
		{
			m_NumObjectsHit = 0;

			m_Ninja.m_ActivationDir = Direction;
			m_Ninja.m_CurrentMoveTime = g_pData->m_Weapons.m_Ninja.m_Movetime * Server()->TickSpeed() / 1000;
			m_Ninja.m_OldVelAmount = length(m_Core.m_Vel);

			GameServer()->CreateSound(m_Pos, SOUND_NINJA_FIRE);
		} break;

	}

	m_AttackTick = Server()->Tick();

	if(m_aWeapons[m_ActiveWeapon].m_Ammo > 0) // -1 == unlimited
		m_aWeapons[m_ActiveWeapon].m_Ammo--;

	if(!m_ReloadTimer)
		m_ReloadTimer = g_pData->m_Weapons.m_aId[m_ActiveWeapon].m_Firedelay * Server()->TickSpeed() / 1000;
}